

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O0

int on_data_chunk_recv_callback
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,uint8_t *data,size_t len,
              void *user_data)

{
  void *in_RCX;
  int in_EDX;
  size_t in_R8;
  long in_R9;
  http2_session_data *session_data;
  
  if (*(int *)(*(long *)(in_R9 + 0x18) + 0x30) == in_EDX) {
    fwrite(in_RCX,1,in_R8,_stdout);
  }
  return 0;
}

Assistant:

static int on_data_chunk_recv_callback(nghttp2_session *session, uint8_t flags,
                                       int32_t stream_id, const uint8_t *data,
                                       size_t len, void *user_data) {
  http2_session_data *session_data = (http2_session_data *)user_data;
  (void)session;
  (void)flags;

  if (session_data->stream_data->stream_id == stream_id) {
    fwrite(data, 1, len, stdout);
  }
  return 0;
}